

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O1

void __thiscall nigel::Token_Identifier::Token_Identifier(Token_Identifier *this,String *identifier)

{
  (this->super_Token).super_enable_shared_from_this<nigel::Token>._M_weak_this.
  super___weak_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_Token).super_enable_shared_from_this<nigel::Token>._M_weak_this.
  super___weak_ptr<nigel::Token,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Token).lineNo = 0;
  (this->super_Token).columnNo = 0;
  (this->super_Token).line.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->super_Token).line.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Token).path.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->super_Token).path.super___shared_ptr<boost::filesystem::path,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Token).type = identifier;
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_Identifier_0018acc8;
  (this->identifier)._M_dataplus._M_p = (pointer)&(this->identifier).field_2;
  (this->identifier)._M_string_length = 0;
  (this->identifier).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->identifier);
  return;
}

Assistant:

Token_Identifier( String identifier ) : Token( Type::identifier )
		{
			this->identifier = identifier;
		}